

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

size_t mem_get_varsize(uint8_t *src,int sz)

{
  uint uVar1;
  undefined4 in_ESI;
  byte *in_RDI;
  ulong local_8;
  
  switch(in_ESI) {
  case 1:
    local_8 = (ulong)*in_RDI;
    break;
  case 2:
    uVar1 = mem_get_le16_as_int(in_RDI);
    local_8 = (ulong)uVar1;
    break;
  case 3:
    uVar1 = mem_get_le24_as_int(in_RDI);
    local_8 = (ulong)uVar1;
    break;
  case 4:
    uVar1 = mem_get_le32_as_int(in_RDI);
    local_8 = (ulong)uVar1;
    break;
  default:
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

static size_t mem_get_varsize(const uint8_t *src, int sz) {
  switch (sz) {
    case 1: return src[0];
    case 2: return mem_get_le16(src);
    case 3: return mem_get_le24(src);
    case 4: return mem_get_le32(src);
    default: assert(0 && "Invalid size"); return -1;
  }
}